

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cc
# Opt level: O1

size_t __thiscall RVO::RVOSimulator::addAgent(RVOSimulator *this,Vector2 *position)

{
  pointer *pppAVar1;
  Agent *pAVar2;
  iterator __position;
  float fVar3;
  float fVar4;
  float fVar5;
  Agent *this_00;
  size_t sVar6;
  Agent *agent;
  Agent *local_20;
  
  if (this->defaultAgent_ == (Agent *)0x0) {
    sVar6 = 0xffffffffffffffff;
  }
  else {
    this_00 = (Agent *)operator_new(0x90);
    Agent::Agent(this_00);
    this_00->position_ = *position;
    pAVar2 = this->defaultAgent_;
    this_00->velocity_ = pAVar2->velocity_;
    __position._M_current =
         (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    this_00->id_ = (long)__position._M_current -
                   (long)(this->agents_).
                         super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
    this_00->maxNeighbors_ = pAVar2->maxNeighbors_;
    fVar3 = pAVar2->neighborDist_;
    fVar4 = pAVar2->radius_;
    fVar5 = pAVar2->timeHorizon_;
    this_00->maxSpeed_ = pAVar2->maxSpeed_;
    this_00->neighborDist_ = fVar3;
    this_00->radius_ = fVar4;
    this_00->timeHorizon_ = fVar5;
    this_00->timeHorizonObst_ = pAVar2->timeHorizonObst_;
    if (__position._M_current ==
        (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_20 = this_00;
      std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::_M_realloc_insert
                (&this->agents_,__position,&local_20);
    }
    else {
      *__position._M_current = this_00;
      pppAVar1 = &(this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppAVar1 = *pppAVar1 + 1;
    }
    sVar6 = ((long)(this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
  }
  return sVar6;
}

Assistant:

std::size_t RVOSimulator::addAgent(const Vector2 &position) {
  if (defaultAgent_ != NULL) {
    Agent *const agent = new Agent();
    agent->position_ = position;
    agent->velocity_ = defaultAgent_->velocity_;
    agent->id_ = agents_.size();
    agent->maxNeighbors_ = defaultAgent_->maxNeighbors_;
    agent->maxSpeed_ = defaultAgent_->maxSpeed_;
    agent->neighborDist_ = defaultAgent_->neighborDist_;
    agent->radius_ = defaultAgent_->radius_;
    agent->timeHorizon_ = defaultAgent_->timeHorizon_;
    agent->timeHorizonObst_ = defaultAgent_->timeHorizonObst_;
    agents_.push_back(agent);

    return agents_.size() - 1U;
  }

  return RVO_ERROR;
}